

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * cmsys::SystemTools::DecodeURL(string *__return_storage_ptr__,string *url)

{
  pointer pcVar1;
  long *plVar2;
  bool bVar3;
  ulong uVar4;
  char bytes [3];
  RegularExpression urlByteRe;
  char local_280;
  char cStack_27f;
  undefined1 uStack_27e;
  undefined5 uStack_27d;
  long local_270 [2];
  RegularExpression local_260;
  
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  RegularExpression::compile(&local_260,"%[0-9a-fA-F][0-9a-fA-F]");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (url->_M_string_length != 0) {
    uVar4 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_280,(ulong)url);
      bVar3 = RegularExpression::find
                        (&local_260,
                         (char *)CONCAT53(uStack_27d,
                                          CONCAT12(uStack_27e,CONCAT11(cStack_27f,local_280))),
                         &local_260.regmatch);
      plVar2 = (long *)CONCAT53(uStack_27d,CONCAT12(uStack_27e,CONCAT11(cStack_27f,local_280)));
      if (plVar2 != local_270) {
        operator_delete(plVar2,local_270[0] + 1);
      }
      if (bVar3) {
        pcVar1 = (url->_M_dataplus)._M_p;
        local_280 = pcVar1[uVar4 + 1];
        cStack_27f = pcVar1[uVar4 + 2];
        uStack_27e = 0;
        strtoul(&local_280,(char **)0x0,0x10);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar4 = uVar4 + 2;
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < url->_M_string_length);
  }
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::DecodeURL(const std::string& url)
{
  kwsys::RegularExpression urlByteRe(VTK_URL_BYTE_REGEX);
  std::string ret;
  for (size_t i = 0; i < url.length(); i++) {
    if (urlByteRe.find(url.substr(i, 3))) {
      char bytes[] = { url[i + 1], url[i + 2], '\0' };
      ret += static_cast<char>(strtoul(bytes, nullptr, 16));
      i += 2;
    } else {
      ret += url[i];
    }
  }
  return ret;
}